

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::QueryNotUsed::Run(QueryNotUsed *this)

{
  GLuint GVar1;
  char *pcVar2;
  char *pcVar3;
  CallLogWrapper *pCVar4;
  undefined4 local_288;
  undefined4 local_284;
  GLint expected2 [12];
  GLenum props2 [12];
  GLint expected [11];
  GLenum props [11];
  allocator<char> local_1c1;
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [32];
  long local_b0;
  long error;
  string local_88 [32];
  GLuint local_68;
  GLuint program2;
  string local_58 [32];
  string local_38 [36];
  GLuint local_14;
  QueryNotUsed *pQStack_10;
  GLuint program;
  QueryNotUsed *this_local;
  
  pQStack_10 = this;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(local_58);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  GVar1 = PIQBase::CreateProgram((PIQBase *)this,pcVar2,pcVar3,false);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  pCVar4 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  local_14 = GVar1;
  glu::CallLogWrapper::glBindAttribLocation(pCVar4,GVar1,0,"position");
  glu::CallLogWrapper::glBindFragDataLocation(pCVar4,local_14,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,local_14);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x18])();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x19])(&error);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  GVar1 = PIQBase::CreateProgram((PIQBase *)this,pcVar2,pcVar3,false);
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string(local_88);
  pCVar4 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  local_68 = GVar1;
  glu::CallLogWrapper::glBindAttribLocation(pCVar4,local_14,0,"p");
  glu::CallLogWrapper::glBindFragDataLocation(pCVar4,local_14,0,"c");
  PIQBase::LinkProgram((PIQBase *)this,local_68);
  glu::CallLogWrapper::glUseProgram(pCVar4,local_68);
  local_b0 = 0;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)local_14);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)local_14,0x92e3,0x92f6,9,&local_b0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)local_14,0x92e4,0x92f5,1,&local_b0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)local_14,0x92e4,0x92f6,6,&local_b0);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"color",&local_d1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xe]
  )(this,(ulong)GVar1,0x92e4,local_d0,0,&local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"position",&local_f9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xe]
  )(this,(ulong)GVar1,0x92e3,local_f8,0,&local_b0);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"color",&local_121);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar1,0x92e4,0,local_120,&local_b0);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_148,"position",&local_149);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar1,0x92e3,0,local_148,&local_b0);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_170,"position",&local_171);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e3,local_170,0,&local_b0);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"color",&local_199);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e4,local_198,0,&local_b0);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"color",&local_1c1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x14])(this,(ulong)GVar1,0x92e4,local_1c0,0,&local_b0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  memcpy(expected + 10,&DAT_029ecdb0,0x2c);
  memset(props2 + 10,0,0x2c);
  props2[10] = 9;
  props2[0xb] = 0x8b52;
  expected[0] = 1;
  expected[6] = 1;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)local_14,0x92e3,0,0xb,expected + 10,0xb,props2 + 10,&local_b0);
  memcpy(expected2 + 10,&DAT_029ecde0,0x30);
  memset(&local_288,0,0x30);
  local_288 = 6;
  local_284 = 0x8b52;
  expected2[0] = 1;
  expected2[2] = 1;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)local_14,0x92e4,0,0xc,expected2 + 10,0xc,&local_288,&local_b0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_14);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_68);
  return local_b0;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		GLuint program2 = CreateProgram(VertexShader2().c_str(), FragmentShader2().c_str(), false);
		glBindAttribLocation(program, 0, "p");
		glBindFragDataLocation(program, 0, "c");
		LinkProgram(program2);
		glUseProgram(program2);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_MAX_NAME_LENGTH, 9, error);
		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_OUTPUT, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_OUTPUT, GL_MAX_NAME_LENGTH, 6, error);

		VerifyGetProgramResourceIndex(program, GL_PROGRAM_OUTPUT, "color", 0, error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, "position", 0, error);

		VerifyGetProgramResourceName(program, GL_PROGRAM_OUTPUT, 0, "color", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, 0, "position", error);

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "position", 0, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "color", 0, error);

		VerifyGetProgramResourceLocationIndex(program, GL_PROGRAM_OUTPUT, "color", 0, error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_GEOMETRY_SHADER,
						   GL_REFERENCED_BY_TESS_CONTROL_SHADER,
						   GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION,
						   GL_IS_PER_PATCH };
		GLint expected[] = { 9, GL_FLOAT_VEC4, 1, 0, 0, 0, 0, 0, 1, 0, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, 0, 11, props, 11, expected, error);

		GLenum props2[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_LOCATION,
							GL_IS_PER_PATCH,
							GL_LOCATION_INDEX };
		GLint expected2[] = { 6, GL_FLOAT_VEC4, 1, 0, 1, 0, 0, 0, 0, 0, 0, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_OUTPUT, 0, 12, props2, 12, expected2, error);

		glDeleteProgram(program);
		glDeleteProgram(program2);
		return error;
	}